

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,ExtensionInfo *extension,CodedInputStream *input,
          FieldSkipper *field_skipper)

{
  FieldType FVar1;
  uint32 value;
  bool bVar2;
  int iVar3;
  LogMessage *other;
  string *psVar4;
  MessageLite *pMVar5;
  ulong value_00;
  uint64 value_01;
  FieldDescriptor *pFVar6;
  uint32 temp;
  undefined4 uStack_74;
  LogFinisher local_39;
  Limit local_38;
  uint32 size;
  
  if (extension->is_packed == true) {
    bVar2 = io::CodedInputStream::ReadVarint32(input,&size);
    if (!bVar2) {
      return false;
    }
    local_38 = io::CodedInputStream::PushLimit(input,size);
    switch(extension->type) {
    case '\x01':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddDouble(this,number,'\x01',true,(double)CONCAT44(uStack_74,temp),extension->descriptor);
      }
      break;
    case '\x02':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddFloat(this,number,'\x02',true,(float)temp,extension->descriptor);
      }
      break;
    case '\x03':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x03',true,CONCAT44(uStack_74,temp),extension->descriptor);
      }
      break;
    case '\x04':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt64(this,number,'\x04',true,CONCAT44(uStack_74,temp),extension->descriptor);
      }
      break;
    case '\x05':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x05',true,temp,extension->descriptor);
      }
      break;
    case '\x06':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt64(this,number,'\x06',true,CONCAT44(uStack_74,temp),extension->descriptor);
      }
      break;
    case '\a':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt32(this,number,'\a',true,temp,extension->descriptor);
      }
      break;
    case '\b':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddBool(this,number,'\b',true,temp != 0,extension->descriptor);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                ((LogMessage *)&temp,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x3ae);
      other = LogMessage::operator<<((LogMessage *)&temp,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_39,other);
      LogMessage::~LogMessage((LogMessage *)&temp);
      break;
    case '\r':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddUInt32(this,number,'\r',true,temp,extension->descriptor);
      }
      break;
    case '\x0e':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        value = temp;
        if (!bVar2) {
          return false;
        }
        bVar2 = (*(extension->field_3).enum_validity_check.func)
                          ((extension->field_3).enum_validity_check.arg,temp);
        if (bVar2) {
          AddEnum(this,number,'\x0e',true,value,extension->descriptor);
        }
      }
      break;
    case '\x0f':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x0f',true,temp,extension->descriptor);
      }
      break;
    case '\x10':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x10',true,CONCAT44(uStack_74,temp),extension->descriptor);
      }
      break;
    case '\x11':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
        if (!bVar2) {
          return false;
        }
        AddInt32(this,number,'\x11',true,-(temp & 1) ^ temp >> 1,extension->descriptor);
      }
      break;
    case '\x12':
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar3) {
        bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
        if (!bVar2) {
          return false;
        }
        AddInt64(this,number,'\x12',true,-(ulong)(temp & 1) ^ CONCAT44(uStack_74,temp) >> 1,
                 extension->descriptor);
      }
    }
    io::CodedInputStream::PopLimit(input,local_38);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',false,(double)CONCAT44(uStack_74,temp),extension->descriptor);
      return true;
    }
    SetDouble(this,number,'\x01',(double)CONCAT44(uStack_74,temp),extension->descriptor);
    return true;
  case '\x02':
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',false,(float)temp,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',(float)temp,extension->descriptor);
    }
    break;
  case '\x03':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_00 = CONCAT44(uStack_74,temp);
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x03';
LAB_00208669:
      SetInt64(this,number,FVar1,value_00,pFVar6);
      return true;
    }
    FVar1 = '\x03';
    goto LAB_00208094;
  case '\x04':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_01 = CONCAT44(uStack_74,temp);
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x04';
LAB_0020867e:
      SetUInt64(this,number,FVar1,value_01,pFVar6);
      return true;
    }
    FVar1 = '\x04';
    goto LAB_002080ce;
  case '\x05':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x05';
LAB_00208601:
      SetInt32(this,number,FVar1,temp,pFVar6);
      return true;
    }
    FVar1 = '\x05';
    goto LAB_00207ef4;
  case '\x06':
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_01 = CONCAT44(uStack_74,temp);
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x06';
      goto LAB_0020867e;
    }
    FVar1 = '\x06';
LAB_002080ce:
    AddUInt64(this,number,FVar1,false,value_01,pFVar6);
    break;
  case '\a':
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
    if (!bVar2) {
      return false;
    }
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\a';
LAB_002086a3:
      SetUInt32(this,number,FVar1,temp,pFVar6);
      return true;
    }
    FVar1 = '\a';
    goto LAB_00208159;
  case '\b':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',false,temp != 0,extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',temp != 0,extension->descriptor);
    }
    break;
  case '\t':
    if (extension->is_repeated == true) {
      psVar4 = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      psVar4 = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadString(input,psVar4);
    goto LAB_002085aa;
  case '\n':
    if (extension->is_repeated == true) {
      pMVar5 = AddMessage(this,number,'\n',(extension->field_3).message_prototype,
                          extension->descriptor);
    }
    else {
      pMVar5 = MutableMessage(this,number,'\n',(extension->field_3).message_prototype,
                              extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadGroup(number,input,pMVar5);
    goto LAB_002085aa;
  case '\v':
    if (extension->is_repeated == true) {
      pMVar5 = AddMessage(this,number,'\v',(extension->field_3).message_prototype,
                          extension->descriptor);
    }
    else {
      pMVar5 = MutableMessage(this,number,'\v',(extension->field_3).message_prototype,
                              extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadMessage(input,pMVar5);
    goto LAB_002085aa;
  case '\f':
    if (extension->is_repeated == true) {
      psVar4 = AddString_abi_cxx11_(this,number,'\f',extension->descriptor);
    }
    else {
      psVar4 = MutableString_abi_cxx11_(this,number,'\f',extension->descriptor);
    }
    bVar2 = WireFormatLite::ReadBytes(input,psVar4);
LAB_002085aa:
    if (bVar2 == false) {
      return false;
    }
    break;
  case '\r':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\r';
      goto LAB_002086a3;
    }
    FVar1 = '\r';
LAB_00208159:
    AddUInt32(this,number,FVar1,false,temp,pFVar6);
    break;
  case '\x0e':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    bVar2 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,temp);
    if (bVar2) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',false,temp,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',temp,extension->descriptor);
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)temp);
    }
    break;
  case '\x0f':
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,&temp);
    if (!bVar2) {
      return false;
    }
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x0f';
      goto LAB_00208601;
    }
    FVar1 = '\x0f';
    goto LAB_00207ef4;
  case '\x10':
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_00 = CONCAT44(uStack_74,temp);
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x10';
      goto LAB_00208669;
    }
    FVar1 = '\x10';
    goto LAB_00208094;
  case '\x11':
    bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
    if (!bVar2) {
      return false;
    }
    temp = -(temp & 1) ^ temp >> 1;
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x11';
      goto LAB_00208601;
    }
    FVar1 = '\x11';
LAB_00207ef4:
    AddInt32(this,number,FVar1,false,temp,pFVar6);
    break;
  case '\x12':
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64 *)&temp);
    if (!bVar2) {
      return false;
    }
    value_00 = -(ulong)(temp & 1) ^ CONCAT44(uStack_74,temp) >> 1;
    pFVar6 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar1 = '\x12';
      goto LAB_00208669;
    }
    FVar1 = '\x12';
LAB_00208094:
    AddInt64(this,number,FVar1,false,value_00,pFVar6);
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(
    int number, const ExtensionInfo& extension,
    io::CodedInputStream* input,
    FieldSkipper* field_skipper) {
  if (extension.is_packed) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)        \
      case WireFormatLite::TYPE_##UPPERCASE:                                   \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPP_LOWERCASE value;                                                 \
          if (!WireFormatLite::ReadPrimitive<                                  \
                  CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(            \
                input, &value)) return false;                                  \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             true, value, extension.descriptor);               \
        }                                                                      \
        break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, true, value,
                    extension.descriptor);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                   \
      case WireFormatLite::TYPE_##UPPERCASE: {                                 \
        CPP_LOWERCASE value;                                                   \
        if (!WireFormatLite::ReadPrimitive<                                    \
                CPP_LOWERCASE, WireFormatLite::TYPE_##UPPERCASE>(              \
               input, &value)) return false;                                   \
        if (extension.is_repeated) {                                          \
          Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,         \
                             false, value, extension.descriptor);              \
        } else {                                                               \
          Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,  \
                             extension.descriptor);                            \
        }                                                                      \
      } break

      HANDLE_TYPE(   INT32,  Int32,   int32);
      HANDLE_TYPE(   INT64,  Int64,   int64);
      HANDLE_TYPE(  UINT32, UInt32,  uint32);
      HANDLE_TYPE(  UINT64, UInt64,  uint64);
      HANDLE_TYPE(  SINT32,  Int32,   int32);
      HANDLE_TYPE(  SINT64,  Int64,   int64);
      HANDLE_TYPE( FIXED32, UInt32,  uint32);
      HANDLE_TYPE( FIXED64, UInt64,  uint64);
      HANDLE_TYPE(SFIXED32,  Int32,   int32);
      HANDLE_TYPE(SFIXED64,  Int64,   int64);
      HANDLE_TYPE(   FLOAT,  Float,   float);
      HANDLE_TYPE(  DOUBLE, Double,  double);
      HANDLE_TYPE(    BOOL,   Bool,    bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, false, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_STRING, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_STRING,
                        extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES:  {
        string* value = extension.is_repeated ?
          AddString(number, WireFormatLite::TYPE_BYTES, extension.descriptor) :
          MutableString(number, WireFormatLite::TYPE_BYTES,
                        extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_GROUP,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_GROUP,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value = extension.is_repeated ?
            AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                       *extension.message_prototype, extension.descriptor) :
            MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                           *extension.message_prototype, extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}